

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O1

void __thiscall QPrintPreviewDialogPrivate::setupActions(QPrintPreviewDialogPrivate *this)

{
  QObject *pQVar1;
  Orientation OVar2;
  QActionGroup *pQVar3;
  QAction *pQVar4;
  long in_FS_OFFSET;
  QLatin1StringView name;
  QLatin1StringView name_00;
  QLatin1StringView name_01;
  QLatin1StringView name_02;
  QLatin1StringView name_03;
  QLatin1StringView name_04;
  QLatin1StringView name_05;
  QLatin1StringView name_06;
  QLatin1StringView name_07;
  QLatin1StringView name_08;
  QLatin1StringView name_09;
  QLatin1StringView name_10;
  QLatin1StringView name_11;
  QLatin1StringView name_12;
  QLatin1StringView name_13;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->navGroup = pQVar3;
  QActionGroup::setExclusive(SUB81(pQVar3,0));
  pQVar3 = this->navGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Next page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->nextPageAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->navGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Previous page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->prevPageAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->navGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","First page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->firstPageAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->navGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Last page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->lastPageAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  name.m_data = "go-next";
  name.m_size = 7;
  qt_setupActionIcon(this->nextPageAction,name);
  name_00.m_data = "go-previous";
  name_00.m_size = 0xb;
  qt_setupActionIcon(this->prevPageAction,name_00);
  name_01.m_data = "go-first";
  name_01.m_size = 8;
  qt_setupActionIcon(this->firstPageAction,name_01);
  name_02.m_data = "go-last";
  name_02.m_size = 7;
  qt_setupActionIcon(this->lastPageAction,name_02);
  QObject::connect(local_50,(char *)this->navGroup,(QObject *)"2triggered(QAction*)",(char *)pQVar1,
                   0x158aa8);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->fitGroup = pQVar3;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Fit width",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->fitWidthAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->fitGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Fit page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->fitPageAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  QVar5.m_size = (size_t)"fitWidthAction";
  QVar5.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->fitWidthAction;
  QObject::setObjectName(QVar5);
  QVar6.m_size = (size_t)"fitPageAction";
  QVar6.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->fitPageAction;
  QObject::setObjectName(QVar6);
  QAction::setCheckable(SUB81(this->fitWidthAction,0));
  QAction::setCheckable(SUB81(this->fitPageAction,0));
  name_03.m_data = "zoom-fit-width";
  name_03.m_size = 0xe;
  qt_setupActionIcon(this->fitWidthAction,name_03);
  name_04.m_data = "zoom-fit-page";
  name_04.m_size = 0xd;
  qt_setupActionIcon(this->fitPageAction,name_04);
  QObject::connect(local_58,(char *)this->fitGroup,(QObject *)"2triggered(QAction*)",(char *)pQVar1,
                   0x158b0c);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->zoomGroup = pQVar3;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Zoom in",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->zoomInAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->zoomGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Zoom out",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->zoomOutAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  name_05.m_data = "zoom-in";
  name_05.m_size = 7;
  qt_setupActionIcon(this->zoomInAction,name_05);
  name_06.m_data = "zoom-out";
  name_06.m_size = 8;
  qt_setupActionIcon(this->zoomOutAction,name_06);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->orientationGroup = pQVar3;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Portrait",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->portraitAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->orientationGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Landscape",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->landscapeAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  QAction::setCheckable(SUB81(this->portraitAction,0));
  QAction::setCheckable(SUB81(this->landscapeAction,0));
  name_07.m_data = "layout-portrait";
  name_07.m_size = 0xf;
  qt_setupActionIcon(this->portraitAction,name_07);
  name_08.m_data = "layout-landscape";
  name_08.m_size = 0x10;
  qt_setupActionIcon(this->landscapeAction,name_08);
  QObject::connect(local_60,(char *)this->portraitAction,(QObject *)"2triggered(bool)",
                   (char *)this->preview,0x158b72);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,(char *)this->landscapeAction,(QObject *)"2triggered(bool)",
                   (char *)this->preview,0x158b8c);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->modeGroup = pQVar3;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Show single page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->singleModeAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->modeGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Show facing pages",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->facingModeAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->modeGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Show overview of all pages",0)
  ;
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->overviewModeAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  name_09.m_data = "view-pages-single";
  name_09.m_size = 0x11;
  qt_setupActionIcon(this->singleModeAction,name_09);
  name_10.m_data = "view-pages-facing";
  name_10.m_size = 0x11;
  qt_setupActionIcon(this->facingModeAction,name_10);
  name_11.m_data = "view-pages-overview";
  name_11.m_size = 0x13;
  qt_setupActionIcon(this->overviewModeAction,name_11);
  QVar7.m_size = (size_t)"singleModeAction";
  QVar7.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->singleModeAction;
  QObject::setObjectName(QVar7);
  QVar8.m_size = (size_t)"facingModeAction";
  QVar8.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->facingModeAction;
  QObject::setObjectName(QVar8);
  QVar9.m_size = (size_t)"overviewModeAction";
  QVar9.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->overviewModeAction;
  QObject::setObjectName(QVar9);
  QAction::setCheckable(SUB81(this->singleModeAction,0));
  QAction::setCheckable(SUB81(this->facingModeAction,0));
  QAction::setCheckable(SUB81(this->overviewModeAction,0));
  QObject::connect(local_70,(char *)this->modeGroup,(QObject *)"2triggered(QAction*)",(char *)pQVar1
                   ,0x158c52);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar1);
  this->printerGroup = pQVar3;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Print",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->printAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar3 = this->printerGroup;
  QCoreApplication::translate((char *)local_48,"QPrintPreviewDialog","Page setup",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  this->pageSetupAction = pQVar4;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  name_12.m_data = "printer";
  name_12.m_size = 7;
  qt_setupActionIcon(this->printAction,name_12);
  name_13.m_data = "page-setup";
  name_13.m_size = 10;
  qt_setupActionIcon(this->pageSetupAction,name_13);
  QObject::connect(local_78,(char *)this->printAction,(QObject *)"2triggered(bool)",(char *)pQVar1,
                   0x158c86);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,(char *)this->pageSetupAction,(QObject *)"2triggered(bool)",
                   (char *)pQVar1,0x158c92);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QAction::setChecked(SUB81(this->fitPageAction,0));
  QAction::setChecked(SUB81(this->singleModeAction,0));
  OVar2 = QPrintPreviewWidget::orientation((QPrintPreviewWidget *)this->preview);
  QAction::setChecked(SUB81((&this->portraitAction)[OVar2 != Portrait],0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::setupActions()
{
    Q_Q(QPrintPreviewDialog);

    // Navigation
    navGroup = new QActionGroup(q);
    navGroup->setExclusive(false);
    nextPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Next page"));
    prevPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Previous page"));
    firstPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "First page"));
    lastPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Last page"));
    qt_setupActionIcon(nextPageAction, "go-next"_L1);
    qt_setupActionIcon(prevPageAction, "go-previous"_L1);
    qt_setupActionIcon(firstPageAction, "go-first"_L1);
    qt_setupActionIcon(lastPageAction, "go-last"_L1);
    QObject::connect(navGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_navigate(QAction*)));


    fitGroup = new QActionGroup(q);
    fitWidthAction = fitGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Fit width"));
    fitPageAction = fitGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Fit page"));
    fitWidthAction->setObjectName("fitWidthAction"_L1);
    fitPageAction->setObjectName("fitPageAction"_L1);
    fitWidthAction->setCheckable(true);
    fitPageAction->setCheckable(true);
    qt_setupActionIcon(fitWidthAction, "zoom-fit-width"_L1);
    qt_setupActionIcon(fitPageAction, "zoom-fit-page"_L1);
    QObject::connect(fitGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_fit(QAction*)));

    // Zoom
    zoomGroup = new QActionGroup(q);
    zoomInAction = zoomGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Zoom in"));
    zoomOutAction = zoomGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Zoom out"));
    qt_setupActionIcon(zoomInAction, "zoom-in"_L1);
    qt_setupActionIcon(zoomOutAction, "zoom-out"_L1);

    // Portrait/Landscape
    orientationGroup = new QActionGroup(q);
    portraitAction = orientationGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Portrait"));
    landscapeAction = orientationGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Landscape"));
    portraitAction->setCheckable(true);
    landscapeAction->setCheckable(true);
    qt_setupActionIcon(portraitAction, "layout-portrait"_L1);
    qt_setupActionIcon(landscapeAction, "layout-landscape"_L1);
    QObject::connect(portraitAction, SIGNAL(triggered(bool)), preview, SLOT(setPortraitOrientation()));
    QObject::connect(landscapeAction, SIGNAL(triggered(bool)), preview, SLOT(setLandscapeOrientation()));

    // Display mode
    modeGroup = new QActionGroup(q);
    singleModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show single page"));
    facingModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show facing pages"));
    overviewModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show overview of all pages"));
    qt_setupActionIcon(singleModeAction, "view-pages-single"_L1);
    qt_setupActionIcon(facingModeAction, "view-pages-facing"_L1);
    qt_setupActionIcon(overviewModeAction, "view-pages-overview"_L1);
    singleModeAction->setObjectName("singleModeAction"_L1);
    facingModeAction->setObjectName("facingModeAction"_L1);
    overviewModeAction->setObjectName("overviewModeAction"_L1);

    singleModeAction->setCheckable(true);
    facingModeAction->setCheckable(true);
    overviewModeAction->setCheckable(true);
    QObject::connect(modeGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_setMode(QAction*)));

    // Print
    printerGroup = new QActionGroup(q);
    printAction = printerGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Print"));
    pageSetupAction = printerGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Page setup"));
    qt_setupActionIcon(printAction, "printer"_L1);
    qt_setupActionIcon(pageSetupAction, "page-setup"_L1);
    QObject::connect(printAction, SIGNAL(triggered(bool)), q, SLOT(_q_print()));
    QObject::connect(pageSetupAction, SIGNAL(triggered(bool)), q, SLOT(_q_pageSetup()));

    // Initial state:
    fitPageAction->setChecked(true);
    singleModeAction->setChecked(true);
    if (preview->orientation() == QPageLayout::Portrait)
        portraitAction->setChecked(true);
    else
        landscapeAction->setChecked(true);
}